

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateSwitch(ExpressionEvalContext *ctx,ExprSwitch *expression)

{
  uint uVar1;
  StackFrame *pSVar2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  TypeBase *pTVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ExprBase *pEVar9;
  ExprBase *pEVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar11;
  ExprBase *expression_00;
  longlong result;
  long local_38;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    uVar1 = (ctx->stackFrames).count;
    if (uVar1 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,
                    "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    pSVar2 = (ctx->stackFrames).data[uVar1 - 1];
    if (pSVar2->targetYield != 0) {
      Report(ctx,"ERROR: can\'t yield back into a switch statement");
      return (ExprBase *)0x0;
    }
    pEVar9 = Evaluate(ctx,expression->condition);
    if (pEVar9 != (ExprBase *)0x0) {
      pEVar9 = (expression->cases).head;
      expression_00 = (expression->blocks).head;
      bVar6 = expression_00 == (ExprBase *)0x0 || pEVar9 == (ExprBase *)0x0;
      if (expression_00 == (ExprBase *)0x0 || pEVar9 == (ExprBase *)0x0) {
        pEVar9 = (ExprBase *)0x0;
      }
      else {
        bVar11 = false;
        do {
          if (ctx->instructionsLimit <= ctx->instruction) {
            Report(ctx,"ERROR: instruction limit reached");
            break;
          }
          ctx->instruction = ctx->instruction + 1;
          if (bVar11) {
LAB_0013f367:
            pEVar10 = Evaluate(ctx,expression_00);
            if (pEVar10 == (ExprBase *)0x0) break;
            if (pSVar2->breakDepth != 0) {
              pSVar2->breakDepth = pSVar2->breakDepth - 1;
              pAVar3 = ctx->ctx->allocator;
              iVar8 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
              pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
              pSVar4 = (expression->super_ExprBase).source;
              pTVar5 = ctx->ctx->typeVoid;
              pEVar9->typeID = 2;
              pEVar9->source = pSVar4;
              pEVar9->type = pTVar5;
              pEVar9->next = (ExprBase *)0x0;
              pEVar9->listed = false;
              pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
              pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
              goto LAB_0013f3b2;
            }
          }
          else {
            pEVar10 = Evaluate(ctx,pEVar9);
            if (pEVar10 == (ExprBase *)0x0) {
LAB_0013f359:
              iVar8 = 1;
            }
            else {
              bVar7 = TryTakeLong(pEVar10,&local_38);
              if (!bVar7) {
                Report(ctx,"ERROR: failed to evaluate \'case\' value");
                goto LAB_0013f359;
              }
              if (local_38 != 0) {
                bVar11 = true;
              }
              iVar8 = (uint)(local_38 == 0) << 2;
            }
            if (iVar8 != 4) {
              if (iVar8 == 0) goto LAB_0013f367;
              break;
            }
          }
          expression_00 = expression_00->next;
          pEVar9 = pEVar9->next;
          bVar6 = expression_00 == (ExprBase *)0x0 || pEVar9 == (ExprBase *)0x0;
        } while (expression_00 != (ExprBase *)0x0 && pEVar9 != (ExprBase *)0x0);
        pEVar9 = (ExprBase *)0x0;
      }
LAB_0013f3b2:
      if (!bVar6) {
        return pEVar9;
      }
      if (expression->defaultBlock != (ExprBase *)0x0) {
        pEVar9 = Evaluate(ctx,expression->defaultBlock);
        if (pEVar9 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        if (pSVar2->breakDepth != 0) {
          pSVar2->breakDepth = pSVar2->breakDepth - 1;
        }
      }
      pAVar3 = ctx->ctx->allocator;
      iVar8 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
      pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar8);
      pSVar4 = (expression->super_ExprBase).source;
      pTVar5 = ctx->ctx->typeVoid;
      pEVar9->typeID = 2;
      pEVar9->source = pSVar4;
      pEVar9->type = pTVar5;
      pEVar9->next = (ExprBase *)0x0;
      pEVar9->listed = false;
      pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
      pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
      return pEVar9;
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateSwitch(ExpressionEvalContext &ctx, ExprSwitch *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(frame->targetYield)
		return Report(ctx, "ERROR: can't yield back into a switch statement");

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	bool matched = false;

	for(ExprBase *currCase = expression->cases.head, *currBlock = expression->blocks.head; currCase && currBlock; currCase = currCase->next, currBlock = currBlock->next)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!matched)
		{
			ExprBase *value = Evaluate(ctx, currCase);

			if(!value)
				return NULL;

			long long result;
			if(!TryTakeLong(value, result))
				return Report(ctx, "ERROR: failed to evaluate 'case' value");

			// Try next case
			if(!result)
				continue;

			matched = true;
		}

		if(!Evaluate(ctx, currBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	if(expression->defaultBlock)
	{
		if(!Evaluate(ctx, expression->defaultBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}